

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O3

void __thiscall QtMWidgets::Switch::mouseReleaseEvent(Switch *this,QMouseEvent *event)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  State SVar5;
  SwitchPrivate *pSVar6;
  int iVar7;
  
  if (*(int *)(event + 0x40) != 1) {
    event[0xc] = (QMouseEvent)0x0;
    return;
  }
  event[0xc] = (QMouseEvent)0x1;
  pSVar6 = (this->d).d;
  pSVar6->leftMouseButtonPressed = false;
  iVar1 = *(int *)(*(long *)&this->field_0x20 + 0x14);
  iVar7 = *(int *)(*(long *)&this->field_0x20 + 0x1c);
  iVar2 = pSVar6->radius;
  iVar3 = pSVar6->mouseMoveDelta;
  iVar4 = FingerGeometry::touchBounce();
  if (iVar4 < iVar3) {
    iVar7 = iVar7 - (iVar1 + iVar2 * 2);
    pSVar6 = (this->d).d;
    SVar5 = pSVar6->state;
    if (pSVar6->offset <= (iVar7 - (iVar7 + 1 >> 0x1f)) + 1 >> 1) {
      if ((SVar5 & ~AcceptedUncheck) != NotAcceptedCheck) {
        if (SVar5 < NotAcceptedCheck) {
          pSVar6->offset = 0;
        }
        goto LAB_0016af1d;
      }
LAB_0016af02:
      SVar5 = NotAcceptedUncheck;
      goto LAB_0016af04;
    }
    if (AcceptedUncheck < SVar5) {
      if ((SVar5 & ~AcceptedUncheck) == NotAcceptedCheck) {
        pSVar6->offset =
             ~*(uint *)(*(long *)&this->field_0x20 + 0x14) +
             *(int *)(*(long *)&this->field_0x20 + 0x1c) + pSVar6->radius * -2;
      }
LAB_0016af1d:
      QWidget::update();
      return;
    }
  }
  else {
    pSVar6 = (this->d).d;
    if (AcceptedUncheck < pSVar6->state) {
      if (1 < pSVar6->state - NotAcceptedCheck) {
        return;
      }
      goto LAB_0016af02;
    }
  }
  SVar5 = NotAcceptedCheck;
LAB_0016af04:
  SwitchPrivate::setState(pSVar6,SVar5);
  return;
}

Assistant:

void
Switch::mouseReleaseEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		event->accept();

		d->leftMouseButtonPressed = false;

		const int distance = rect().width() - d->radius * 2;

		if( d->mouseMoveDelta <= FingerGeometry::touchBounce() )
		{
			switch( d->state )
			{
				case NotAcceptedCheck :
				case AcceptedCheck :
					d->setState( NotAcceptedUncheck );
				break;

				case NotAcceptedUncheck :
				case AcceptedUncheck :
					d->setState( NotAcceptedCheck );
				break;

				default :
					break;
			}

			return;
		}

		if( d->offset <= distance / 2 )
		{
			switch( d->state )
			{
				case NotAcceptedCheck :
				case AcceptedCheck :
					d->setState( NotAcceptedUncheck );
				break;

				default :
				{
					d->initOffset( rect() );
					update();
				}
				break;
			}
		}
		else
		{
			switch( d->state )
			{
				case NotAcceptedUncheck :
				case AcceptedUncheck :
					d->setState( NotAcceptedCheck );
				break;

				default :
				{
					d->initOffset( rect() );
					update();
				}
				break;
			}
		}
	}
	else
		event->ignore();
}